

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::SeekHead::Parse(SeekHead *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  Entry *pEVar6;
  VoidElement *pVVar7;
  long lVar8;
  VoidElement *local_120;
  Entry *local_108;
  Entry *local_e8;
  ptrdiff_t count_;
  VoidElement *e_1;
  Entry *e;
  long status_1;
  longlong size_1;
  longlong id_1;
  longlong idpos;
  VoidElement *pVoidElement;
  Entry *pEntry;
  ulong local_88;
  VoidElement *local_80;
  undefined1 local_61;
  ulong local_60;
  Entry *local_58;
  long local_50;
  long status;
  longlong size;
  longlong id;
  int void_element_count;
  int entry_count;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  SeekHead *this_local;
  
  pos = (longlong)this->m_pSegment->m_pReader;
  stop = this->m_start;
  _void_element_count = this->m_start + this->m_size;
  id._4_4_ = 0;
  id._0_4_ = 0;
  pReader = (IMkvReader *)this;
  while (stop < _void_element_count) {
    local_50 = ParseElementHeader((IMkvReader *)pos,&stop,_void_element_count,&size,&status);
    if (local_50 < 0) {
      return local_50;
    }
    if (size == 0x4dbb) {
      id._4_4_ = id._4_4_ + 1;
    }
    else if (size == 0xec) {
      id._0_4_ = (int)id + 1;
    }
    stop = status + stop;
    if (_void_element_count < stop) {
      return -2;
    }
  }
  if (stop != _void_element_count) {
    return -2;
  }
  if (0 < id._4_4_) {
    uVar4 = (ulong)id._4_4_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar5 = SUB168(auVar1 * ZEXT816(0x20),0);
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pEVar6 = (Entry *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    local_61 = 0;
    local_e8 = (Entry *)0x0;
    if ((pEVar6 != (Entry *)0x0) &&
       (local_61 = 1, local_e8 = pEVar6, local_60 = uVar5, local_58 = pEVar6, uVar4 != 0)) {
      local_108 = pEVar6;
      do {
        Entry::Entry(local_108);
        local_108 = local_108 + 1;
      } while (local_108 != pEVar6 + uVar4);
    }
    this->m_entries = local_e8;
    if (this->m_entries == (Entry *)0x0) {
      return -1;
    }
  }
  if (0 < (int)id) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)id;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pVVar7 = (VoidElement *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
    pEntry._7_1_ = pVVar7 != (VoidElement *)0x0;
    local_120 = (VoidElement *)0x0;
    if ((bool)pEntry._7_1_) {
      local_120 = pVVar7;
      local_88 = uVar4;
      local_80 = pVVar7;
    }
    this->m_void_elements = local_120;
    if (this->m_void_elements == (VoidElement *)0x0) {
      return -1;
    }
  }
  pVoidElement = (VoidElement *)this->m_entries;
  idpos = (longlong)this->m_void_elements;
  stop = this->m_start;
  while (stop < _void_element_count) {
    id_1 = stop;
    lVar8 = ParseElementHeader((IMkvReader *)pos,&stop,_void_element_count,&size_1,&status_1);
    if (lVar8 < 0) {
      return lVar8;
    }
    if ((size_1 == 0x4dbb) && (0 < id._4_4_)) {
      bVar3 = ParseEntry((IMkvReader *)pos,stop,status_1,(Entry *)pVoidElement);
      if (bVar3) {
        pVoidElement[1].element_start = id_1;
        pVoidElement[1].element_size = (stop + status_1) - id_1;
        pVoidElement = pVoidElement + 2;
      }
    }
    else if ((size_1 == 0xec) && (0 < (int)id)) {
      *(longlong *)idpos = id_1;
      *(longlong *)(idpos + 8) = (stop + status_1) - id_1;
      idpos = idpos + 0x10;
    }
    stop = status_1 + stop;
    if (_void_element_count < stop) {
      return -2;
    }
  }
  if (stop != _void_element_count) {
    return -2;
  }
  lVar8 = (long)pVoidElement - (long)this->m_entries >> 5;
  if (lVar8 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63c,"long mkvparser::SeekHead::Parse()");
  }
  if (id._4_4_ < lVar8) {
    __assert_fail("count_ <= entry_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63d,"long mkvparser::SeekHead::Parse()");
  }
  this->m_entry_count = (int)lVar8;
  lVar8 = idpos - (long)this->m_void_elements >> 4;
  if (lVar8 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x642,"long mkvparser::SeekHead::Parse()");
  }
  if ((int)id < lVar8) {
    __assert_fail("count_ <= void_element_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x643,"long mkvparser::SeekHead::Parse()");
  }
  this->m_void_element_count = (int)lVar8;
  return 0;
}

Assistant:

long SeekHead::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  // first count the seek head entries

  int entry_count = 0;
  int void_element_count = 0;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek)
      ++entry_count;
    else if (id == libwebm::kMkvVoid)
      ++void_element_count;

    pos += size;  // consume payload

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (entry_count > 0) {
    m_entries = new (std::nothrow) Entry[entry_count];

    if (m_entries == NULL)
      return -1;
  }

  if (void_element_count > 0) {
    m_void_elements = new (std::nothrow) VoidElement[void_element_count];

    if (m_void_elements == NULL)
      return -1;
  }

  // now parse the entries and void elements

  Entry* pEntry = m_entries;
  VoidElement* pVoidElement = m_void_elements;

  pos = m_start;

  while (pos < stop) {
    const long long idpos = pos;

    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek && entry_count > 0) {
      if (ParseEntry(pReader, pos, size, pEntry)) {
        Entry& e = *pEntry++;

        e.element_start = idpos;
        e.element_size = (pos + size) - idpos;
      }
    } else if (id == libwebm::kMkvVoid && void_element_count > 0) {
      VoidElement& e = *pVoidElement++;

      e.element_start = idpos;
      e.element_size = (pos + size) - idpos;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  ptrdiff_t count_ = ptrdiff_t(pEntry - m_entries);
  assert(count_ >= 0);
  assert(count_ <= entry_count);

  m_entry_count = static_cast<int>(count_);

  count_ = ptrdiff_t(pVoidElement - m_void_elements);
  assert(count_ >= 0);
  assert(count_ <= void_element_count);

  m_void_element_count = static_cast<int>(count_);

  return 0;
}